

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O1

void TestPlusCompare(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uVar5;
  Vector<const_char> value;
  Vector<const_char> value_00;
  Vector<const_char> value_01;
  Vector<const_char> value_02;
  Vector<const_char> value_03;
  Vector<const_char> value_04;
  Vector<const_char> value_05;
  Vector<const_char> value_06;
  Vector<const_char> value_07;
  Vector<const_char> value_08;
  Vector<const_char> value_09;
  Vector<const_char> value_10;
  Vector<const_char> value_11;
  Vector<const_char> value_12;
  Vector<const_char> value_13;
  Vector<const_char> value_14;
  Vector<const_char> value_15;
  Vector<const_char> value_16;
  Vector<const_char> value_17;
  Vector<const_char> value_18;
  Vector<const_char> value_19;
  Vector<const_char> value_20;
  Vector<const_char> value_21;
  Vector<const_char> value_22;
  Vector<const_char> value_23;
  Vector<const_char> value_24;
  Vector<const_char> value_25;
  Vector<const_char> value_26;
  Vector<const_char> value_27;
  Vector<const_char> value_28;
  Vector<const_char> value_29;
  Vector<const_char> value_30;
  Vector<const_char> value_31;
  Vector<const_char> value_32;
  Vector<const_char> value_33;
  Vector<const_char> value_34;
  Vector<const_char> value_35;
  Vector<const_char> value_36;
  Vector<const_char> value_37;
  Vector<const_char> value_38;
  Vector<const_char> value_39;
  Vector<const_char> value_40;
  Vector<const_char> value_41;
  Vector<const_char> value_42;
  Vector<const_char> value_43;
  Vector<const_char> value_44;
  Vector<const_char> value_45;
  Vector<const_char> value_46;
  Vector<const_char> value_47;
  Vector<const_char> value_48;
  Vector<const_char> value_49;
  Vector<const_char> value_50;
  Vector<const_char> value_51;
  Vector<const_char> value_52;
  Vector<const_char> value_53;
  Vector<const_char> value_54;
  Vector<const_char> value_55;
  Vector<const_char> value_56;
  Vector<const_char> value_57;
  Vector<const_char> value_58;
  Vector<const_char> value_59;
  Vector<const_char> value_60;
  Vector<const_char> value_61;
  Vector<const_char> value_62;
  Vector<const_char> value_63;
  Vector<const_char> value_64;
  Vector<const_char> value_65;
  Vector<const_char> value_66;
  Vector<const_char> value_67;
  Vector<const_char> value_68;
  Bignum c;
  Bignum b;
  Bignum a;
  Bignum local_62c;
  Bignum local_428;
  Bignum local_224;
  
  local_224.used_bigits_ = 0;
  local_224.exponent_ = 0;
  local_428.used_bigits_ = 0;
  local_428.exponent_ = 0;
  local_62c.used_bigits_ = 0;
  local_62c.exponent_ = 0;
  double_conversion::Bignum::AssignUInt16(&local_224,1);
  double_conversion::Bignum::AssignUInt16(&local_428,0);
  double_conversion::Bignum::AssignUInt16(&local_62c,1);
  iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
  if (iVar1 != 0) {
    uVar3 = 0x4a0;
    goto LAB_00826bce;
  }
  iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
  if (iVar1 != 0) {
    pcVar2 = "Bignum::PlusEqual(a, b, c)";
    uVar3 = 0x4a1;
LAB_00826870:
    printf("%s:%d:\n CHECK(%s) failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum.cc"
           ,uVar3,pcVar2);
    abort();
  }
  iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
  if (0 < iVar1) {
    pcVar2 = "Bignum::PlusLessEqual(a, b, c)";
    uVar3 = 0x4a2;
    goto LAB_00826870;
  }
  iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
  if (iVar1 < 0) {
    pcVar2 = "!Bignum::PlusLess(a, b, c)";
    uVar3 = 0x4a3;
    goto LAB_00826870;
  }
  double_conversion::Bignum::AssignUInt16(&local_224,0);
  double_conversion::Bignum::AssignUInt16(&local_428,0);
  double_conversion::Bignum::AssignUInt16(&local_62c,1);
  iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
  if (iVar1 != -1) {
    uVar3 = 0x4a8;
    goto LAB_00826c1d;
  }
  iVar1 = double_conversion::Bignum::PlusCompare(&local_62c,&local_428,&local_224);
  if (iVar1 != 1) {
    pcVar2 = "+1";
    pcVar4 = "Bignum::PlusCompare(c, b, a)";
    uVar3 = 0x4a9;
    goto LAB_00826c49;
  }
  iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
  if (iVar1 == 0) {
    pcVar2 = "!Bignum::PlusEqual(a, b, c)";
    uVar3 = 0x4aa;
    goto LAB_00826870;
  }
  iVar1 = double_conversion::Bignum::PlusCompare(&local_62c,&local_428,&local_224);
  if (iVar1 == 0) {
    pcVar2 = "!Bignum::PlusEqual(c, b, a)";
    uVar3 = 0x4ab;
    goto LAB_00826870;
  }
  iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
  if (0 < iVar1) {
    pcVar2 = "Bignum::PlusLessEqual(a, b, c)";
    uVar3 = 0x4ac;
    goto LAB_00826870;
  }
  iVar1 = double_conversion::Bignum::PlusCompare(&local_62c,&local_428,&local_224);
  if (iVar1 < 1) {
    pcVar2 = "!Bignum::PlusLessEqual(c, b, a)";
    uVar3 = 0x4ad;
    goto LAB_00826870;
  }
  iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
  if (-1 < iVar1) {
    pcVar2 = "Bignum::PlusLess(a, b, c)";
    uVar3 = 0x4ae;
    goto LAB_00826870;
  }
  iVar1 = double_conversion::Bignum::PlusCompare(&local_62c,&local_428,&local_224);
  if (iVar1 < 0) {
    pcVar2 = "!Bignum::PlusLess(c, b, a)";
    uVar3 = 0x4af;
    goto LAB_00826870;
  }
  value._8_8_ = 0x15;
  value.start_ = "1234567890ABCDEF12345";
  double_conversion::Bignum::AssignHexString(&local_224,value);
  double_conversion::Bignum::AssignUInt16(&local_428,1);
  value_00._8_8_ = 0x15;
  value_00.start_ = "1234567890ABCDEF12345";
  double_conversion::Bignum::AssignHexString(&local_62c,value_00);
  iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
  if (iVar1 != 1) {
    pcVar2 = "+1";
    pcVar4 = "Bignum::PlusCompare(a, b, c)";
    uVar3 = 0x4b4;
    goto LAB_00826c49;
  }
  value_01._8_8_ = 0x15;
  value_01.start_ = "1234567890ABCDEF12344";
  double_conversion::Bignum::AssignHexString(&local_224,value_01);
  double_conversion::Bignum::AssignUInt16(&local_428,1);
  value_02._8_8_ = 0x15;
  value_02.start_ = "1234567890ABCDEF12345";
  double_conversion::Bignum::AssignHexString(&local_62c,value_02);
  iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
  if (iVar1 == 0) {
    value_03._8_8_ = 10;
    value_03.start_ = "1234567890";
    double_conversion::Bignum::AssignHexString(&local_224,value_03);
    double_conversion::Bignum::ShiftLeft(&local_224,0x2c);
    value_04._8_8_ = 0xb;
    value_04.start_ = "ABCDEF12345";
    double_conversion::Bignum::AssignHexString(&local_428,value_04);
    value_05._8_8_ = 0x15;
    value_05.start_ = "1234567890ABCDEF12345";
    double_conversion::Bignum::AssignHexString(&local_62c,value_05);
    iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
    if (iVar1 == 0) {
      value_06._8_8_ = 10;
      value_06.start_ = "1234567890";
      double_conversion::Bignum::AssignHexString(&local_224,value_06);
      double_conversion::Bignum::ShiftLeft(&local_224,0x2c);
      value_07._8_8_ = 0xb;
      value_07.start_ = "ABCDEF12344";
      double_conversion::Bignum::AssignHexString(&local_428,value_07);
      value_08._8_8_ = 0x15;
      value_08.start_ = "1234567890ABCDEF12345";
      double_conversion::Bignum::AssignHexString(&local_62c,value_08);
      iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
      if (iVar1 != -1) {
        uVar3 = 0x4c5;
        goto LAB_00826c1d;
      }
      value_09._8_8_ = 10;
      value_09.start_ = "1234567890";
      double_conversion::Bignum::AssignHexString(&local_224,value_09);
      double_conversion::Bignum::ShiftLeft(&local_224,0x2c);
      value_10._8_8_ = 0xb;
      value_10.start_ = "ABCDEF12346";
      double_conversion::Bignum::AssignHexString(&local_428,value_10);
      value_11._8_8_ = 0x15;
      value_11.start_ = "1234567890ABCDEF12345";
      double_conversion::Bignum::AssignHexString(&local_62c,value_11);
      iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
      if (iVar1 == 1) {
        value_12._8_8_ = 10;
        value_12.start_ = "1234567891";
        double_conversion::Bignum::AssignHexString(&local_224,value_12);
        double_conversion::Bignum::ShiftLeft(&local_224,0x2c);
        value_13._8_8_ = 0xb;
        value_13.start_ = "ABCDEF12345";
        double_conversion::Bignum::AssignHexString(&local_428,value_13);
        value_14._8_8_ = 0x15;
        value_14.start_ = "1234567890ABCDEF12345";
        double_conversion::Bignum::AssignHexString(&local_62c,value_14);
        iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
        if (iVar1 == 1) {
          value_15._8_8_ = 10;
          value_15.start_ = "1234567889";
          double_conversion::Bignum::AssignHexString(&local_224,value_15);
          double_conversion::Bignum::ShiftLeft(&local_224,0x2c);
          value_16._8_8_ = 0xb;
          value_16.start_ = "ABCDEF12345";
          double_conversion::Bignum::AssignHexString(&local_428,value_16);
          value_17._8_8_ = 0x15;
          value_17.start_ = "1234567890ABCDEF12345";
          double_conversion::Bignum::AssignHexString(&local_62c,value_17);
          iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
          if (iVar1 == -1) {
            value_18._8_8_ = 10;
            value_18.start_ = "1234567890";
            double_conversion::Bignum::AssignHexString(&local_224,value_18);
            double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
            value_19._8_8_ = 0xb;
            value_19.start_ = "ABCDEF12345";
            double_conversion::Bignum::AssignHexString(&local_428,value_19);
            double_conversion::Bignum::ShiftLeft(&local_428,0x20);
            value_20._8_8_ = 0x15;
            value_20.start_ = "1234567890ABCDEF12345";
            double_conversion::Bignum::AssignHexString(&local_62c,value_20);
            double_conversion::Bignum::ShiftLeft(&local_62c,0x20);
            iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
            if (iVar1 != 0) {
              uVar3 = 0x4df;
              goto LAB_00826bce;
            }
            value_21._8_8_ = 10;
            value_21.start_ = "1234567890";
            double_conversion::Bignum::AssignHexString(&local_224,value_21);
            double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
            value_22._8_8_ = 0xb;
            value_22.start_ = "ABCDEF12344";
            double_conversion::Bignum::AssignHexString(&local_428,value_22);
            double_conversion::Bignum::ShiftLeft(&local_428,0x20);
            value_23._8_8_ = 0x15;
            value_23.start_ = "1234567890ABCDEF12345";
            double_conversion::Bignum::AssignHexString(&local_62c,value_23);
            double_conversion::Bignum::ShiftLeft(&local_62c,0x20);
            iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
            if (iVar1 == -1) {
              value_24._8_8_ = 10;
              value_24.start_ = "1234567890";
              double_conversion::Bignum::AssignHexString(&local_224,value_24);
              double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
              value_25._8_8_ = 0xb;
              value_25.start_ = "ABCDEF12346";
              double_conversion::Bignum::AssignHexString(&local_428,value_25);
              double_conversion::Bignum::ShiftLeft(&local_428,0x20);
              value_26._8_8_ = 0x15;
              value_26.start_ = "1234567890ABCDEF12345";
              double_conversion::Bignum::AssignHexString(&local_62c,value_26);
              double_conversion::Bignum::ShiftLeft(&local_62c,0x20);
              iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
              if (iVar1 == 1) {
                value_27._8_8_ = 10;
                value_27.start_ = "1234567891";
                double_conversion::Bignum::AssignHexString(&local_224,value_27);
                double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
                value_28._8_8_ = 0xb;
                value_28.start_ = "ABCDEF12345";
                double_conversion::Bignum::AssignHexString(&local_428,value_28);
                double_conversion::Bignum::ShiftLeft(&local_428,0x20);
                value_29._8_8_ = 0x15;
                value_29.start_ = "1234567890ABCDEF12345";
                double_conversion::Bignum::AssignHexString(&local_62c,value_29);
                double_conversion::Bignum::ShiftLeft(&local_62c,0x20);
                iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
                if (iVar1 == 1) {
                  value_30._8_8_ = 10;
                  value_30.start_ = "1234567889";
                  double_conversion::Bignum::AssignHexString(&local_224,value_30);
                  double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
                  value_31._8_8_ = 0xb;
                  value_31.start_ = "ABCDEF12345";
                  double_conversion::Bignum::AssignHexString(&local_428,value_31);
                  double_conversion::Bignum::ShiftLeft(&local_428,0x20);
                  value_32._8_8_ = 0x15;
                  value_32.start_ = "1234567890ABCDEF12345";
                  double_conversion::Bignum::AssignHexString(&local_62c,value_32);
                  double_conversion::Bignum::ShiftLeft(&local_62c,0x20);
                  iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c);
                  if (iVar1 == -1) {
                    value_33._8_8_ = 10;
                    value_33.start_ = "1234567890";
                    double_conversion::Bignum::AssignHexString(&local_224,value_33);
                    double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
                    value_34._8_8_ = 0xb;
                    value_34.start_ = "ABCDEF12345";
                    double_conversion::Bignum::AssignHexString(&local_428,value_34);
                    double_conversion::Bignum::ShiftLeft(&local_428,0x20);
                    value_35._8_8_ = 0x1d;
                    value_35.start_ = "1234567890ABCDEF1234500000000";
                    double_conversion::Bignum::AssignHexString(&local_62c,value_35);
                    iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c)
                    ;
                    if (iVar1 != 0) {
                      uVar3 = 0x506;
                      goto LAB_00826bce;
                    }
                    value_36._8_8_ = 10;
                    value_36.start_ = "1234567890";
                    double_conversion::Bignum::AssignHexString(&local_224,value_36);
                    double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
                    value_37._8_8_ = 0xb;
                    value_37.start_ = "ABCDEF12344";
                    double_conversion::Bignum::AssignHexString(&local_428,value_37);
                    double_conversion::Bignum::ShiftLeft(&local_428,0x20);
                    value_38._8_8_ = 0x1d;
                    value_38.start_ = "1234567890ABCDEF1234500000000";
                    double_conversion::Bignum::AssignHexString(&local_62c,value_38);
                    iVar1 = double_conversion::Bignum::PlusCompare(&local_224,&local_428,&local_62c)
                    ;
                    if (iVar1 == -1) {
                      value_39._8_8_ = 10;
                      value_39.start_ = "1234567890";
                      double_conversion::Bignum::AssignHexString(&local_224,value_39);
                      double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
                      value_40._8_8_ = 0xb;
                      value_40.start_ = "ABCDEF12346";
                      double_conversion::Bignum::AssignHexString(&local_428,value_40);
                      double_conversion::Bignum::ShiftLeft(&local_428,0x20);
                      value_41._8_8_ = 0x1d;
                      value_41.start_ = "1234567890ABCDEF1234500000000";
                      double_conversion::Bignum::AssignHexString(&local_62c,value_41);
                      iVar1 = double_conversion::Bignum::PlusCompare
                                        (&local_224,&local_428,&local_62c);
                      if (iVar1 == 1) {
                        value_42._8_8_ = 10;
                        value_42.start_ = "1234567891";
                        double_conversion::Bignum::AssignHexString(&local_224,value_42);
                        double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
                        value_43._8_8_ = 0xb;
                        value_43.start_ = "ABCDEF12345";
                        double_conversion::Bignum::AssignHexString(&local_428,value_43);
                        double_conversion::Bignum::ShiftLeft(&local_428,0x20);
                        value_44._8_8_ = 0x1d;
                        value_44.start_ = "1234567890ABCDEF1234500000000";
                        double_conversion::Bignum::AssignHexString(&local_62c,value_44);
                        iVar1 = double_conversion::Bignum::PlusCompare
                                          (&local_224,&local_428,&local_62c);
                        if (iVar1 == 1) {
                          value_45._8_8_ = 10;
                          value_45.start_ = "1234567889";
                          double_conversion::Bignum::AssignHexString(&local_224,value_45);
                          double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
                          value_46._8_8_ = 0xb;
                          value_46.start_ = "ABCDEF12345";
                          double_conversion::Bignum::AssignHexString(&local_428,value_46);
                          double_conversion::Bignum::ShiftLeft(&local_428,0x20);
                          value_47._8_8_ = 0x1d;
                          value_47.start_ = "1234567890ABCDEF1234500000000";
                          double_conversion::Bignum::AssignHexString(&local_62c,value_47);
                          iVar1 = double_conversion::Bignum::PlusCompare
                                            (&local_224,&local_428,&local_62c);
                          if (iVar1 == -1) {
                            value_48._8_8_ = 10;
                            value_48.start_ = "1234567890";
                            double_conversion::Bignum::AssignHexString(&local_224,value_48);
                            double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
                            value_49._8_8_ = 0xb;
                            value_49.start_ = "ABCDEF12345";
                            double_conversion::Bignum::AssignHexString(&local_428,value_49);
                            value_50._8_8_ = 0x1d;
                            value_50.start_ = "123456789000000000ABCDEF12345";
                            double_conversion::Bignum::AssignHexString(&local_62c,value_50);
                            iVar1 = double_conversion::Bignum::PlusCompare
                                              (&local_224,&local_428,&local_62c);
                            if (iVar1 != 0) {
                              uVar3 = 0x528;
                              goto LAB_00826bce;
                            }
                            value_51._8_8_ = 10;
                            value_51.start_ = "1234567890";
                            double_conversion::Bignum::AssignHexString(&local_224,value_51);
                            double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
                            value_52._8_8_ = 0xb;
                            value_52.start_ = "ABCDEF12346";
                            double_conversion::Bignum::AssignHexString(&local_428,value_52);
                            value_53._8_8_ = 0x1d;
                            value_53.start_ = "123456789000000000ABCDEF12345";
                            double_conversion::Bignum::AssignHexString(&local_62c,value_53);
                            iVar1 = double_conversion::Bignum::PlusCompare
                                              (&local_224,&local_428,&local_62c);
                            if (iVar1 != 1) {
                              pcVar2 = "1";
                              pcVar4 = "Bignum::PlusCompare(a, b, c)";
                              uVar3 = 0x52e;
                              goto LAB_00826c49;
                            }
                            value_54._8_8_ = 10;
                            value_54.start_ = "1234567890";
                            double_conversion::Bignum::AssignHexString(&local_224,value_54);
                            double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
                            value_55._8_8_ = 0xb;
                            value_55.start_ = "ABCDEF12344";
                            double_conversion::Bignum::AssignHexString(&local_428,value_55);
                            value_56._8_8_ = 0x1d;
                            value_56.start_ = "123456789000000000ABCDEF12345";
                            double_conversion::Bignum::AssignHexString(&local_62c,value_56);
                            iVar1 = double_conversion::Bignum::PlusCompare
                                              (&local_224,&local_428,&local_62c);
                            if (iVar1 == -1) {
                              value_57._8_8_ = 10;
                              value_57.start_ = "1234567890";
                              double_conversion::Bignum::AssignHexString(&local_224,value_57);
                              double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
                              value_58._8_8_ = 0xb;
                              value_58.start_ = "ABCDEF12345";
                              double_conversion::Bignum::AssignHexString(&local_428,value_58);
                              double_conversion::Bignum::ShiftLeft(&local_428,0x10);
                              value_59._8_8_ = 0x1d;
                              value_59.start_ = "12345678900000ABCDEF123450000";
                              double_conversion::Bignum::AssignHexString(&local_62c,value_59);
                              iVar1 = double_conversion::Bignum::PlusCompare
                                                (&local_224,&local_428,&local_62c);
                              if (iVar1 != 0) {
                                uVar3 = 0x53b;
                                goto LAB_00826bce;
                              }
                              value_60._8_8_ = 10;
                              value_60.start_ = "1234567890";
                              double_conversion::Bignum::AssignHexString(&local_224,value_60);
                              double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
                              value_61._8_8_ = 0xb;
                              value_61.start_ = "ABCDEF12344";
                              double_conversion::Bignum::AssignHexString(&local_428,value_61);
                              double_conversion::Bignum::ShiftLeft(&local_428,0x10);
                              value_62._8_8_ = 0x1d;
                              value_62.start_ = "12345678900000ABCDEF123450000";
                              double_conversion::Bignum::AssignHexString(&local_62c,value_62);
                              iVar1 = double_conversion::Bignum::PlusCompare
                                                (&local_224,&local_428,&local_62c);
                              if (iVar1 == -1) {
                                value_63._8_8_ = 10;
                                value_63.start_ = "1234567890";
                                double_conversion::Bignum::AssignHexString(&local_224,value_63);
                                double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
                                value_64._8_8_ = 0xb;
                                value_64.start_ = "ABCDEF12345";
                                double_conversion::Bignum::AssignHexString(&local_428,value_64);
                                double_conversion::Bignum::ShiftLeft(&local_428,0x10);
                                value_65._8_8_ = 0x1d;
                                value_65.start_ = "12345678900000ABCDEF123450001";
                                double_conversion::Bignum::AssignHexString(&local_62c,value_65);
                                iVar1 = double_conversion::Bignum::PlusCompare
                                                  (&local_224,&local_428,&local_62c);
                                if (iVar1 == -1) {
                                  value_66._8_8_ = 10;
                                  value_66.start_ = "1234567890";
                                  double_conversion::Bignum::AssignHexString(&local_224,value_66);
                                  double_conversion::Bignum::ShiftLeft(&local_224,0x4c);
                                  value_67._8_8_ = 0xb;
                                  value_67.start_ = "ABCDEF12346";
                                  double_conversion::Bignum::AssignHexString(&local_428,value_67);
                                  double_conversion::Bignum::ShiftLeft(&local_428,0x10);
                                  value_68._8_8_ = 0x1d;
                                  value_68.start_ = "12345678900000ABCDEF123450000";
                                  double_conversion::Bignum::AssignHexString(&local_62c,value_68);
                                  iVar1 = double_conversion::Bignum::PlusCompare
                                                    (&local_224,&local_428,&local_62c);
                                  if (iVar1 == 1) {
                                    return;
                                  }
                                  pcVar2 = "+1";
                                  pcVar4 = "Bignum::PlusCompare(a, b, c)";
                                  uVar3 = 0x550;
                                  goto LAB_00826c49;
                                }
                                uVar3 = 0x549;
                              }
                              else {
                                uVar3 = 0x542;
                              }
                            }
                            else {
                              uVar3 = 0x534;
                            }
                          }
                          else {
                            uVar3 = 0x522;
                          }
                          goto LAB_00826c1d;
                        }
                        pcVar2 = "1";
                        pcVar4 = "Bignum::PlusCompare(a, b, c)";
                        uVar3 = 0x51b;
                      }
                      else {
                        pcVar2 = "1";
                        pcVar4 = "Bignum::PlusCompare(a, b, c)";
                        uVar3 = 0x514;
                      }
                      goto LAB_00826c49;
                    }
                    uVar3 = 0x50d;
                  }
                  else {
                    uVar3 = 0x4ff;
                  }
                  goto LAB_00826c1d;
                }
                pcVar2 = "1";
                pcVar4 = "Bignum::PlusCompare(a, b, c)";
                uVar3 = 0x4f7;
              }
              else {
                pcVar2 = "1";
                pcVar4 = "Bignum::PlusCompare(a, b, c)";
                uVar3 = 0x4ef;
              }
              goto LAB_00826c49;
            }
            uVar3 = 0x4e7;
          }
          else {
            uVar3 = 0x4d7;
          }
LAB_00826c1d:
          pcVar4 = "Bignum::PlusCompare(a, b, c)";
          pcVar2 = "-1";
          uVar5 = 0xffffffff;
          goto LAB_00826c4f;
        }
        pcVar2 = "1";
        pcVar4 = "Bignum::PlusCompare(a, b, c)";
        uVar3 = 0x4d1;
      }
      else {
        pcVar2 = "1";
        pcVar4 = "Bignum::PlusCompare(a, b, c)";
        uVar3 = 0x4cb;
      }
LAB_00826c49:
      uVar5 = 1;
      goto LAB_00826c4f;
    }
    uVar3 = 0x4bf;
  }
  else {
    uVar3 = 0x4b9;
  }
LAB_00826bce:
  pcVar4 = "Bignum::PlusCompare(a, b, c)";
  pcVar2 = "0";
  uVar5 = 0;
LAB_00826c4f:
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum.cc"
         ,uVar3,pcVar2,pcVar4,uVar5,iVar1);
  abort();
}

Assistant:

TEST(PlusCompare) {
  Bignum a;
  Bignum b;
  Bignum c;
  a.AssignUInt16(1);
  b.AssignUInt16(0);
  c.AssignUInt16(1);
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));
  CHECK(Bignum::PlusEqual(a, b, c));
  CHECK(Bignum::PlusLessEqual(a, b, c));
  CHECK(!Bignum::PlusLess(a, b, c));

  a.AssignUInt16(0);
  b.AssignUInt16(0);
  c.AssignUInt16(1);
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));
  CHECK_EQ(+1, Bignum::PlusCompare(c, b, a));
  CHECK(!Bignum::PlusEqual(a, b, c));
  CHECK(!Bignum::PlusEqual(c, b, a));
  CHECK(Bignum::PlusLessEqual(a, b, c));
  CHECK(!Bignum::PlusLessEqual(c, b, a));
  CHECK(Bignum::PlusLess(a, b, c));
  CHECK(!Bignum::PlusLess(c, b, a));

  AssignHexString(&a, "1234567890ABCDEF12345");
  b.AssignUInt16(1);
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(+1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890ABCDEF12344");
  b.AssignUInt16(1);
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4);
  AssignHexString(&b, "ABCDEF12345");
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4);
  AssignHexString(&b, "ABCDEF12344");
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4);
  AssignHexString(&b, "ABCDEF12346");
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567891");
  a.ShiftLeft(11*4);
  AssignHexString(&b, "ABCDEF12345");
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567889");
  a.ShiftLeft(11*4);
  AssignHexString(&b, "ABCDEF12345");
  AssignHexString(&c, "1234567890ABCDEF12345");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF12345");
  c.ShiftLeft(32);
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12344");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF12345");
  c.ShiftLeft(32);
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12346");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF12345");
  c.ShiftLeft(32);
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567891");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF12345");
  c.ShiftLeft(32);
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567889");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF12345");
  c.ShiftLeft(32);
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF1234500000000");
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12344");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF1234500000000");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12346");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF1234500000000");
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567891");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF1234500000000");
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567889");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(32);
  AssignHexString(&c, "1234567890ABCDEF1234500000000");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  AssignHexString(&c, "123456789000000000ABCDEF12345");
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12346");
  AssignHexString(&c, "123456789000000000ABCDEF12345");
  CHECK_EQ(1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12344");
  AssignHexString(&c, "123456789000000000ABCDEF12345");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(16);
  AssignHexString(&c, "12345678900000ABCDEF123450000");
  CHECK_EQ(0, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12344");
  b.ShiftLeft(16);
  AssignHexString(&c, "12345678900000ABCDEF123450000");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12345");
  b.ShiftLeft(16);
  AssignHexString(&c, "12345678900000ABCDEF123450001");
  CHECK_EQ(-1, Bignum::PlusCompare(a, b, c));

  AssignHexString(&a, "1234567890");
  a.ShiftLeft(11*4 + 32);
  AssignHexString(&b, "ABCDEF12346");
  b.ShiftLeft(16);
  AssignHexString(&c, "12345678900000ABCDEF123450000");
  CHECK_EQ(+1, Bignum::PlusCompare(a, b, c));
}